

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power,ImGuiDragFlags flags)

{
  char cVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  unsigned_long_long v_min_00;
  longlong v_min_01;
  float fVar8;
  double dVar9;
  float v_max_00;
  double v_max_01;
  ImS32 v32;
  uint local_4c;
  float local_48;
  float local_44;
  double *local_40;
  double *local_38;
  
  pIVar2 = GImGui;
  if (GImGui->ActiveId == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if (GImGui->NavActivatePressedId == id) {
        cVar1 = GImGui->ActiveIdIsJustActivated;
        goto joined_r0x001735a4;
      }
    }
    else if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
      cVar1 = (GImGui->IO).MouseDown[0];
joined_r0x001735a4:
      if (cVar1 == '\0') {
        local_48 = v_speed;
        local_44 = power;
        local_40 = (double *)v_max;
        local_38 = (double *)v;
        ClearActiveID();
        v = local_38;
        v_max = local_40;
        v_speed = local_48;
        power = local_44;
      }
    }
  }
  if (pIVar2->ActiveId != id) {
    return false;
  }
  switch(data_type) {
  case 0:
    local_4c = (uint)*v;
    if (v_min == (void *)0x0) {
      iVar6 = -0x80;
    }
    else {
      iVar6 = (int)*v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      iVar4 = 0x7f;
    }
    else {
      iVar4 = (int)(char)*v_max;
    }
    bVar3 = DragBehaviorT<int,int,float>(4,(int *)&local_4c,v_speed,iVar6,iVar4,format,power,flags);
    break;
  case 1:
    local_4c = (uint)*v;
    if (v_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      uVar5 = 0xff;
    }
    else {
      uVar5 = (uint)*v_max;
    }
    bVar3 = DragBehaviorT<unsigned_int,int,float>
                      (5,&local_4c,v_speed,uVar7,uVar5,format,power,flags);
    break;
  case 2:
    local_4c = (uint)*v;
    if (v_min == (void *)0x0) {
      iVar6 = -0x8000;
    }
    else {
      iVar6 = (int)*v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      iVar4 = 0x7fff;
    }
    else {
      iVar4 = (int)(short)*v_max;
    }
    bVar3 = DragBehaviorT<int,int,float>(4,(int *)&local_4c,v_speed,iVar6,iVar4,format,power,flags);
    goto LAB_001737bb;
  case 3:
    local_4c = (uint)*v;
    if (v_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      uVar5 = 0xffff;
    }
    else {
      uVar5 = (uint)*v_max;
    }
    bVar3 = DragBehaviorT<unsigned_int,int,float>
                      (5,&local_4c,v_speed,uVar7,uVar5,format,power,flags);
LAB_001737bb:
    if (bVar3 == false) {
      return false;
    }
    *(undefined2 *)v = (undefined2)local_4c;
    return bVar3;
  case 4:
    if (v_min == (void *)0x0) {
      iVar6 = -0x80000000;
    }
    else {
      iVar6 = *v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      fVar8 = NAN;
    }
    else {
      fVar8 = *v_max;
    }
    bVar3 = DragBehaviorT<int,int,float>(4,(int *)v,v_speed,iVar6,(int)fVar8,format,power,flags);
    return bVar3;
  case 5:
    if (v_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      fVar8 = -NAN;
    }
    else {
      fVar8 = *v_max;
    }
    bVar3 = DragBehaviorT<unsigned_int,int,float>
                      (5,(uint *)v,v_speed,uVar7,(uint)fVar8,format,power,flags);
    return bVar3;
  case 6:
    dVar9 = NAN;
    if (v_min == (void *)0x0) {
      v_min_01 = -0x8000000000000000;
    }
    else {
      v_min_01 = *v_min;
    }
    if ((double *)v_max != (double *)0x0) {
      dVar9 = *v_max;
    }
    bVar3 = DragBehaviorT<long_long,long_long,double>
                      (6,(longlong *)v,v_speed,v_min_01,(longlong)dVar9,format,power,flags);
    return bVar3;
  case 7:
    if (v_min == (void *)0x0) {
      v_min_00 = 0;
    }
    else {
      v_min_00 = *v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      dVar9 = -NAN;
    }
    else {
      dVar9 = *v_max;
    }
    bVar3 = DragBehaviorT<unsigned_long_long,long_long,double>
                      (7,(unsigned_long_long *)v,v_speed,v_min_00,(unsigned_long_long)dVar9,format,
                       power,flags);
    return bVar3;
  case 8:
    if (v_min == (void *)0x0) {
      fVar8 = -3.4028235e+38;
    }
    else {
      fVar8 = *v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      v_max_00 = 3.4028235e+38;
    }
    else {
      v_max_00 = *v_max;
    }
    bVar3 = DragBehaviorT<float,float,float>(8,(float *)v,v_speed,fVar8,v_max_00,format,power,flags)
    ;
    return bVar3;
  case 9:
    if (v_min == (void *)0x0) {
      dVar9 = -1.79769313486232e+308;
    }
    else {
      dVar9 = *v_min;
    }
    if ((double *)v_max == (double *)0x0) {
      v_max_01 = 1.79769313486232e+308;
    }
    else {
      v_max_01 = *v_max;
    }
    bVar3 = DragBehaviorT<double,double,double>
                      (9,(double *)v,v_speed,dVar9,v_max_01,format,power,flags);
    return bVar3;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x7eb,
                  "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, float, ImGuiDragFlags)"
                 );
  }
  if (bVar3 != false) {
    *(undefined1 *)v = (undefined1)local_4c;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:     { ImS32 v32 = (ImS32)*(ImS8*)v;  bool r = DragBehaviorT<ImS32, ImS32, float >(ImGuiDataType_S32, &v32, v_speed, v_min ? *(const ImS8*) v_min : IM_S8_MIN,  v_max ? *(const ImS8*)v_max  : IM_S8_MAX,  format, power, flags); if (r) *(ImS8*)v = (ImS8)v32; return r; }
    case ImGuiDataType_U8:     { ImU32 v32 = (ImU32)*(ImU8*)v;  bool r = DragBehaviorT<ImU32, ImS32, float >(ImGuiDataType_U32, &v32, v_speed, v_min ? *(const ImU8*) v_min : IM_U8_MIN,  v_max ? *(const ImU8*)v_max  : IM_U8_MAX,  format, power, flags); if (r) *(ImU8*)v = (ImU8)v32; return r; }
    case ImGuiDataType_S16:    { ImS32 v32 = (ImS32)*(ImS16*)v; bool r = DragBehaviorT<ImS32, ImS32, float >(ImGuiDataType_S32, &v32, v_speed, v_min ? *(const ImS16*)v_min : IM_S16_MIN, v_max ? *(const ImS16*)v_max : IM_S16_MAX, format, power, flags); if (r) *(ImS16*)v = (ImS16)v32; return r; }
    case ImGuiDataType_U16:    { ImU32 v32 = (ImU32)*(ImU16*)v; bool r = DragBehaviorT<ImU32, ImS32, float >(ImGuiDataType_U32, &v32, v_speed, v_min ? *(const ImU16*)v_min : IM_U16_MIN, v_max ? *(const ImU16*)v_max : IM_U16_MAX, format, power, flags); if (r) *(ImU16*)v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}